

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t *
Abc_NtkCollectCopies(Abc_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **__s;
  void *__s_00;
  Vec_Bit_t *pVVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint Entry;
  size_t __size;
  long lVar15;
  ulong uVar16;
  
  piVar4 = (int *)0x0;
  __ptr = Abc_NtkDfs(p,0);
  iVar3 = p->vObjs->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar14 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar14;
  if (iVar14 != 0) {
    piVar4 = (int *)malloc((long)iVar14 << 2);
  }
  p_00->pArray = piVar4;
  uVar2 = pGia->nObjs;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  uVar11 = 8;
  if (6 < uVar2 - 1) {
    uVar11 = uVar2;
  }
  pVVar5->nCap = uVar11;
  if (uVar11 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar11 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = uVar2;
  sVar8 = 0;
  memset(__s,0,(long)(int)uVar2 << 3);
  iVar14 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  iVar3 = iVar14 * 0x20;
  if (iVar14 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    sVar8 = (long)iVar14 * 4;
    __s_00 = malloc(sVar8);
  }
  __size = 0;
  memset(__s_00,0,sVar8);
  pVVar6 = (Vec_Bit_t *)malloc(0x10);
  pVVar6->nCap = iVar3;
  if (iVar14 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    __size = (long)iVar14 << 2;
    piVar4 = (int *)malloc(__size);
  }
  pVVar6->pArray = piVar4;
  pVVar6->nSize = iVar3;
  memset(piVar4,0,__size);
  pVVar10 = pGia->vCis;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      iVar14 = pVVar10->pArray[lVar12];
      if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) goto LAB_003b03da;
      if (iVar14 == 0) break;
      if (p->vCis->nSize <= lVar12) goto LAB_003b03f9;
      pcVar7 = Abc_ObjName((Abc_Obj_t *)p->vCis->pArray[lVar12]);
      if (pcVar7 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar7);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar7);
      }
      if ((int)uVar2 <= iVar14) goto LAB_003b0418;
      __s[iVar14] = pcVar9;
      lVar12 = lVar12 + 1;
      pVVar10 = pGia->vCis;
    } while (lVar12 < pVVar10->nSize);
  }
  pVVar10 = pGia->vCos;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      iVar14 = pVVar10->pArray[lVar12];
      lVar15 = (long)iVar14;
      if ((lVar15 < 0) || (pGia->nObjs <= iVar14)) goto LAB_003b03da;
      if (iVar14 == 0) break;
      uVar11 = iVar14 - (*(uint *)(pGia->pObjs + lVar15) & 0x1fffffff);
      if (((int)uVar11 < 0) || (iVar3 <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s_00 + (ulong)(uVar11 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar11 & 0x1f);
      if (p->vCos->nSize <= lVar12) goto LAB_003b03f9;
      pcVar7 = Abc_ObjName((Abc_Obj_t *)p->vCos->pArray[lVar12]);
      if (pcVar7 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar7);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar7);
      }
      if ((int)uVar2 <= iVar14) {
LAB_003b0418:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      __s[lVar15] = pcVar9;
      Vec_IntPush(p_00,iVar14);
      lVar12 = lVar12 + 1;
      pVVar10 = pGia->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar12 = 0;
    do {
      uVar11 = (((Abc_Obj_t *)__ptr->pArray[lVar12])->field_6).iTemp;
      if (-1 < (int)uVar11) {
        Entry = uVar11 >> 1;
        if (pGia->nObjs <= (int)Entry) {
LAB_003b03da:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + Entry) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + Entry)) {
          if (iVar3 <= (int)Entry) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          uVar16 = (ulong)(uVar11 >> 6);
          uVar13 = 1 << ((byte)Entry & 0x1f);
          if ((*(uint *)((long)__s_00 + uVar16 * 4) >> (Entry & 0x1f) & 1) == 0) {
            if ((int)uVar2 <= (int)Entry) {
LAB_003b03f9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (__s[Entry] == (void *)0x0) {
              pcVar7 = Abc_ObjName((Abc_Obj_t *)__ptr->pArray[lVar12]);
              if (pcVar7 == (char *)0x0) {
                pcVar9 = (char *)0x0;
              }
              else {
                sVar8 = strlen(pcVar7);
                pcVar9 = (char *)malloc(sVar8 + 1);
                strcpy(pcVar9,pcVar7);
              }
              __s[Entry] = pcVar9;
              Vec_IntPush(p_00,Entry);
              if ((uVar11 & 1) == 0) {
                piVar4[uVar16] = piVar4[uVar16] & ~uVar13;
              }
              else {
                piVar4[uVar16] = piVar4[uVar16] | uVar13;
              }
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < __ptr->nSize);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  *pvNodesR = pVVar5;
  *pvPolar = pVVar6;
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCopies( Abc_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vObjs   = Abc_NtkDfs( p, 0 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Abc_NtkObjNumMax(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCi(p, i))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vObjs, pObj, i )
        if ( (iLit = pObj->iTemp) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Abc_ObjName(pObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_PtrFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}